

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_NtkDfsNets_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vNets)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  
  if ((*(uint *)&pNet->field_0x14 & 0xf) == 6) {
    iVar2 = Abc_NodeIsTravIdCurrent(pNet);
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pNet);
      plVar1 = (long *)pNet->pNtk->vObjs->pArray[*(pNet->vFanins).pArray];
      for (lVar3 = 0; lVar3 < *(int *)((long)plVar1 + 0x1c); lVar3 = lVar3 + 1) {
        Abc_NtkDfsNets_rec(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                            (long)*(int *)(plVar1[4] + lVar3 * 4) * 8),vNets);
      }
      for (lVar3 = 0; lVar3 < *(int *)((long)plVar1 + 0x2c); lVar3 = lVar3 + 1) {
        Vec_PtrPush(vNets,*(void **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                    (long)*(int *)(plVar1[6] + lVar3 * 4) * 8));
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsNet(pNet)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                ,0x2e4,"void Abc_NtkDfsNets_rec(Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NtkDfsNets_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vNets )
{
    Abc_Obj_t * pNext;
    Abc_Obj_t * pNode; int i;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return;
    Abc_NodeSetTravIdCurrent( pNet );
    pNode = Abc_ObjFanin0( pNet );
    Abc_ObjForEachFanin( pNode, pNext, i )
        Abc_NtkDfsNets_rec( pNext, vNets );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Vec_PtrPush( vNets, pNext );
}